

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall
QWidgetPrivate::setStyle_helper(QWidgetPrivate *this,QStyle *newStyle,bool propagate)

{
  long *plVar1;
  QWidget *this_00;
  int *piVar2;
  QWExtra *pQVar3;
  int *piVar4;
  QArrayData *pQVar5;
  long lVar6;
  QStyle *pQVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  QStyleSheetStyle *this_01;
  long *plVar11;
  long lVar12;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  pQVar7 = QWidget::style(this_00);
  createExtra(this);
  piVar2 = (int *)(((this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>
                    ._M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                    super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->style).wp.d;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  pQVar3 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (newStyle == (QStyle *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = QtSharedPointer::ExternalRefCountData::getAndRef(&newStyle->super_QObject);
  }
  piVar4 = (int *)(pQVar3->style).wp.d;
  (pQVar3->style).wp.d = (Data *)uVar8;
  *(QStyle **)((long)&(pQVar3->style).wp + 8) = newStyle;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      operator_delete(piVar4);
    }
  }
  if ((this->polished != (QMetaObject *)0x0) &&
     ((char)(this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i != '\x11')) {
    (**(code **)(*(long *)pQVar7 + 0x68))(pQVar7,this_00);
    pQVar7 = QWidget::style(this_00);
    (**(code **)(*(long *)pQVar7 + 0x60))(pQVar7,this_00);
  }
  if (propagate) {
    pQVar5 = *(QArrayData **)&this->field_0x18;
    lVar10 = *(long *)&this->field_0x20;
    lVar6 = *(long *)&this->field_0x28;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (lVar6 != 0) {
      lVar12 = 0;
      do {
        lVar9 = *(long *)(lVar10 + lVar12 * 8);
        if ((lVar9 == 0) || ((*(byte *)(*(long *)(lVar9 + 8) + 0x30) & 1) == 0)) {
          lVar9 = 0;
        }
        if (lVar9 != 0) {
          inheritStyle(*(QWidgetPrivate **)(lVar9 + 8));
        }
        lVar12 = lVar12 + 1;
      } while (lVar6 != lVar12);
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,8,0x10);
      }
    }
  }
  lVar10 = QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
  if ((lVar10 == 0) &&
     (this_01 = (QStyleSheetStyle *)
                QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject),
     this_01 != (QStyleSheetStyle *)0x0)) {
    QStyleSheetStyle::clearWidgetFont(this_01,this_00);
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_48,StyleChange);
  QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_48);
  plVar11 = (long *)QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
  if (plVar11 != (long *)0x0) {
    plVar1 = plVar11 + 3;
    *(int *)plVar1 = (int)*plVar1 + -1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar11 + 0x20))(plVar11);
    }
  }
  QEvent::~QEvent((QEvent *)&local_48);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::setStyle_helper(QStyle *newStyle, bool propagate)
{
    Q_Q(QWidget);
    QStyle *oldStyle = q->style();

    createExtra();

#ifndef QT_NO_STYLE_STYLESHEET
    QPointer<QStyle> origStyle = extra->style;
#endif
    extra->style = newStyle;

    // repolish
    if (polished && q->windowType() != Qt::Desktop) {
        oldStyle->unpolish(q);
        q->style()->polish(q);
    }

    if (propagate) {
        // We copy the list because the order may be modified
        const QObjectList childrenList = children;
        for (int i = 0; i < childrenList.size(); ++i) {
            QWidget *c = qobject_cast<QWidget*>(childrenList.at(i));
            if (c)
                c->d_func()->inheritStyle();
        }
    }

#ifndef QT_NO_STYLE_STYLESHEET
    if (!qt_styleSheet(newStyle)) {
        if (const QStyleSheetStyle* cssStyle = qt_styleSheet(origStyle)) {
            cssStyle->clearWidgetFont(q);
        }
    }
#endif

    QEvent e(QEvent::StyleChange);
    QCoreApplication::sendEvent(q, &e);

#ifndef QT_NO_STYLE_STYLESHEET
    // dereference the old stylesheet style
    if (QStyleSheetStyle *proxy = qt_styleSheet(origStyle))
        proxy->deref();
#endif
}